

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

_Bool get_separator(HttpProxyNegotiator *s,char sep)

{
  _Bool local_29;
  ulong local_28;
  size_t pos;
  char sep_local;
  HttpProxyNegotiator *s_local;
  
  local_28 = s->header_pos;
  while( true ) {
    local_29 = false;
    if (local_28 < s->header->len) {
      local_29 = is_whitespace(s->header->s[local_28]);
    }
    if (local_29 == false) break;
    local_28 = local_28 + 1;
  }
  if (local_28 == s->header->len) {
    s_local._7_1_ = false;
  }
  else if (s->header->s[local_28] == sep) {
    s->header_pos = local_28 + 1;
    s_local._7_1_ = true;
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool get_separator(HttpProxyNegotiator *s, char sep)
{
    size_t pos = s->header_pos;

    while (pos < s->header->len && is_whitespace(s->header->s[pos]))
        pos++;

    if (pos == s->header->len)
        return false;                  /* end of string */

    if (s->header->s[pos] != sep)
        return false;

    s->header_pos = ++pos;
    return true;
}